

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

void checksum_final(chksumwork_conflict *sumwrk,chksumval_conflict *sumval)

{
  sumalg sVar1;
  _func_int_archive_md5_ctx_ptr_void_ptr **pp_Var2;
  long lVar3;
  size_t sVar4;
  
  sVar1 = sumwrk->alg;
  sVar4 = (size_t)sVar1;
  if (sVar4 != 0) {
    if (sVar1 == CKSUM_SHA1) {
      pp_Var2 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      sVar4 = 0x14;
      lVar3 = 0x10;
    }
    else {
      if (sVar1 != CKSUM_MD5) goto LAB_0016124f;
      pp_Var2 = &__archive_digest.md5final;
      sVar4 = 0x10;
      lVar3 = 8;
    }
    (**pp_Var2)((archive_md5_ctx *)((long)&sumwrk->alg + lVar3),sumval->val);
  }
  sumval->len = sVar4;
LAB_0016124f:
  sumval->alg = sumwrk->alg;
  return;
}

Assistant:

static void
checksum_final(struct chksumwork *sumwrk, struct chksumval *sumval)
{

	switch (sumwrk->alg) {
	case CKSUM_NONE:
		sumval->len = 0;
		break;
	case CKSUM_SHA1:
		archive_sha1_final(&(sumwrk->sha1ctx), sumval->val);
		sumval->len = SHA1_SIZE;
		break;
	case CKSUM_MD5:
		archive_md5_final(&(sumwrk->md5ctx), sumval->val);
		sumval->len = MD5_SIZE;
		break;
	}
	sumval->alg = sumwrk->alg;
}